

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_parentlessUsingRemoveAllVariables_Test::TestBody
          (Variable_parentlessUsingRemoveAllVariables_Test *this)

{
  string *psVar1;
  Message MVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr comp1;
  ModelPtr m;
  long *local_90;
  shared_ptr<libcellml::ParentedEntity> local_88;
  AssertionResult local_78;
  long local_68 [2];
  AssertHelper local_58 [8];
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  psVar1 = local_20;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"modelName","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  psVar1 = local_30;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"component1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  psVar1 = local_40;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"variable1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  psVar1 = local_50;
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"variable2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"dimensionless","");
  libcellml::Variable::setUnits(local_40);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"dimensionless","");
  libcellml::Variable::setUnits(local_50);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_30);
  libcellml::Component::addVariable((shared_ptr *)local_30);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_20);
  MVar2 = (Message)libcellml::ParentedEntity::hasParent();
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       MVar2;
  if (MVar2 == (Message)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)&local_88,"v1->hasParent()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4d8,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar3 = libcellml::ParentedEntity::hasParent();
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT71(local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._1_7_,cVar3);
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)&local_88,"v2->hasParent()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4d9,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Component::removeAllVariables();
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_90 = (long *)libcellml::Component::variableCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_78,"size_t(0)","comp1->variableCount()",(unsigned_long *)&local_88,
             (unsigned_long *)&local_90);
  if ((string)local_78.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4de,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_88.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar3 = libcellml::ParentedEntity::hasParent();
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,cVar3) ^ 1);
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)&local_88,"v1->hasParent()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4df,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar3 = libcellml::ParentedEntity::hasParent();
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (CONCAT71(local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr._1_7_,cVar3) ^ 1);
  local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)&local_88,"v2->hasParent()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4e0,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90 = (long *)0x0;
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((internal *)&local_78,"nullptr","v1->parent()",&local_90,&local_88);
  if (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_78.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4e1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_88.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_90 = (long *)0x0;
  libcellml::ParentedEntity::parent();
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ParentedEntity>>
            ((internal *)&local_78,"nullptr","v2->parent()",&local_90,&local_88);
  if (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_78.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x4e2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         (local_88.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0)) {
        (**(code **)(*(long *)local_88.
                              super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Variable, parentlessUsingRemoveAllVariables)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");
    v2->setName("variable2");

    v1->setUnits("dimensionless");
    v2->setUnits("dimensionless");

    comp1->addVariable(v1);
    comp1->addVariable(v2);
    m->addComponent(comp1);

    EXPECT_TRUE(v1->hasParent());
    EXPECT_TRUE(v2->hasParent());

    // Make a variable without a parent component.
    comp1->removeAllVariables();

    EXPECT_EQ(size_t(0), comp1->variableCount());
    EXPECT_FALSE(v1->hasParent());
    EXPECT_FALSE(v2->hasParent());
    EXPECT_EQ(nullptr, v1->parent());
    EXPECT_EQ(nullptr, v2->parent());
}